

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFVersion.cc
# Opt level: O3

void __thiscall PDFVersion::getVersion(PDFVersion *this,string *version,int *extension_level)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  long *plVar4;
  undefined8 *puVar5;
  uint uVar6;
  ulong *puVar7;
  ulong uVar8;
  uint uVar9;
  string __str_1;
  string __str;
  ulong *local_b0;
  long local_a8;
  ulong local_a0;
  long lStack_98;
  ulong *local_90;
  long local_88;
  ulong local_80 [2];
  long *local_70;
  undefined8 local_68;
  long local_60;
  undefined8 uStack_58;
  long *local_50 [2];
  long local_40 [2];
  
  *extension_level = this->extension_level;
  uVar1 = this->major_version;
  uVar2 = -uVar1;
  if (0 < (int)uVar1) {
    uVar2 = uVar1;
  }
  uVar9 = 1;
  if (9 < uVar2) {
    uVar8 = (ulong)uVar2;
    uVar3 = 4;
    do {
      uVar9 = uVar3;
      uVar6 = (uint)uVar8;
      if (uVar6 < 100) {
        uVar9 = uVar9 - 2;
        goto LAB_001307fa;
      }
      if (uVar6 < 1000) {
        uVar9 = uVar9 - 1;
        goto LAB_001307fa;
      }
      if (uVar6 < 10000) goto LAB_001307fa;
      uVar8 = uVar8 / 10000;
      uVar3 = uVar9 + 4;
    } while (99999 < uVar6);
    uVar9 = uVar9 + 1;
  }
LAB_001307fa:
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct((ulong)local_50,(char)uVar9 - (char)((int)uVar1 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((long)local_50[0] + (ulong)(uVar1 >> 0x1f)),uVar9,uVar2);
  plVar4 = (long *)std::__cxx11::string::append((char *)local_50);
  puVar7 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar7) {
    local_a0 = *puVar7;
    lStack_98 = plVar4[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *puVar7;
    local_b0 = (ulong *)*plVar4;
  }
  local_a8 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  uVar1 = this->minor_version;
  uVar2 = -uVar1;
  if (0 < (int)uVar1) {
    uVar2 = uVar1;
  }
  uVar9 = 1;
  if (9 < uVar2) {
    uVar8 = (ulong)uVar2;
    uVar3 = 4;
    do {
      uVar9 = uVar3;
      uVar6 = (uint)uVar8;
      if (uVar6 < 100) {
        uVar9 = uVar9 - 2;
        goto LAB_001308e8;
      }
      if (uVar6 < 1000) {
        uVar9 = uVar9 - 1;
        goto LAB_001308e8;
      }
      if (uVar6 < 10000) goto LAB_001308e8;
      uVar8 = uVar8 / 10000;
      uVar3 = uVar9 + 4;
    } while (99999 < uVar6);
    uVar9 = uVar9 + 1;
  }
LAB_001308e8:
  local_90 = local_80;
  std::__cxx11::string::_M_construct((ulong)&local_90,(char)uVar9 - (char)((int)uVar1 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar1 >> 0x1f) + (long)local_90),uVar9,uVar2);
  uVar8 = 0xf;
  if (local_b0 != &local_a0) {
    uVar8 = local_a0;
  }
  if (uVar8 < (ulong)(local_88 + local_a8)) {
    uVar8 = 0xf;
    if (local_90 != local_80) {
      uVar8 = local_80[0];
    }
    if ((ulong)(local_88 + local_a8) <= uVar8) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_b0);
      goto LAB_00130974;
    }
  }
  puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_90);
LAB_00130974:
  local_70 = &local_60;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_60 = *plVar4;
    uStack_58 = puVar5[3];
  }
  else {
    local_60 = *plVar4;
    local_70 = (long *)*puVar5;
  }
  local_68 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  std::__cxx11::string::operator=((string *)version,(string *)&local_70);
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if (local_90 != local_80) {
    operator_delete(local_90,local_80[0] + 1);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0 + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return;
}

Assistant:

void
PDFVersion::getVersion(std::string& version, int& extension_level) const
{
    extension_level = this->extension_level;
    version = std::to_string(this->major_version) + "." + std::to_string(this->minor_version);
}